

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_model_v2_smt.c
# Opt level: O3

MPP_RET check_re_enc_smt(RcModelV2SmtCtx *ctx,EncRcTaskInfo *cfg)

{
  MppEncRcDropFrmMode MVar1;
  ulong uVar2;
  RK_S32 RVar3;
  int iVar4;
  RK_S32 RVar5;
  MPP_RET MVar6;
  int iVar7;
  MPP_RET MVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  
  iVar9 = (ctx->usr_cfg).stats_time;
  uVar11 = ctx->frame_type;
  RVar3 = mpp_data_sum_v2(ctx->stat_bits);
  iVar4 = (int)((long)RVar3 / (long)iVar9);
  RVar5 = mpp_data_get_pre_val_v2(ctx->stat_bits,-1);
  uVar2 = (long)((iVar4 * iVar9 - RVar5) + cfg->bit_real) / (long)iVar9;
  uVar10 = uVar2 & 0xffffffff;
  if ((rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2_smt","enter %p\n","check_re_enc_smt",ctx);
  }
  if ((rc_debug & 0x40) != 0) {
    _mpp_log_l(4,"rc_model_v2_smt","reenc check target_bps %d last_ins_bps %d ins_bps %d",
               "check_re_enc_smt",(ulong)(uint)(ctx->usr_cfg).bps_target,
               (long)RVar3 / (long)iVar9 & 0xffffffff,uVar10);
  }
  MVar8 = MPP_OK;
  if (ctx->reenc_cnt < (ctx->usr_cfg).max_reencode_times) {
    MVar6 = check_super_frame_smt(ctx,cfg);
    MVar8 = MPP_NOK;
    if ((MVar6 == MPP_OK) &&
       (((ctx->usr_cfg).debreath_cfg.enable == 0 || (MVar8 = MPP_OK, ctx->first_frm_flg != 0)))) {
      if ((rc_debug & 0x200) != 0) {
        _mpp_log_l(4,"rc_model_v2_smt","drop mode %d frame_type %d\n",(char *)0x0,
                   (ulong)(ctx->usr_cfg).drop_mode,(ulong)uVar11);
      }
      MVar1 = (ctx->usr_cfg).drop_mode;
      iVar9 = (int)uVar2;
      if (uVar11 == 0 && MVar1 != MPP_ENC_RC_DROP_FRM_DISABLED) {
        uVar11 = (uint)((float)(((ctx->usr_cfg).drop_thd + 100) * (ctx->usr_cfg).bps_max) * 0.01);
        if ((rc_debug & 0x200) != 0) {
          _mpp_log_l(4,"rc_model_v2_smt","drop mode %d check max_bps %d bit_thr %d ins_bps %d",
                     (char *)0x0,(ulong)MVar1,(ulong)(uint)(ctx->usr_cfg).bps_target,(ulong)uVar11,
                     uVar10);
        }
        MVar8 = -(uint)((int)uVar11 < iVar9);
      }
      else {
        if (uVar11 == 0) {
          iVar7 = cfg->bit_max * 3;
        }
        else {
          iVar7 = 0;
          if (uVar11 == 2) {
            iVar7 = (cfg->bit_max * 3) / 2;
          }
        }
        MVar8 = MPP_OK;
        if ((iVar7 < cfg->bit_real) &&
           (iVar7 = (ctx->usr_cfg).bps_max, iVar7 - (iVar7 >> 3) < iVar9)) {
          MVar8 = -(uint)(iVar7 / 0x14 < iVar9 - iVar4);
        }
        if ((rc_debug & 1) != 0) {
          _mpp_log_l(4,"rc_model_v2_smt","leave %p ret %d\n","check_re_enc_smt",ctx,
                     (ulong)(uint)MVar8);
        }
      }
    }
  }
  return MVar8;
}

Assistant:

MPP_RET check_re_enc_smt(RcModelV2SmtCtx *ctx, EncRcTaskInfo *cfg)
{
    RcCfg *usr_cfg = &ctx->usr_cfg;
    RK_S32 frame_type = ctx->frame_type;
    RK_S32 bit_thr = 0;
    RK_S32 stat_time = usr_cfg->stats_time;
    RK_S32 last_ins_bps = mpp_data_sum_v2(ctx->stat_bits) / stat_time;
    RK_S32 ins_bps = (last_ins_bps * stat_time - mpp_data_get_pre_val_v2(ctx->stat_bits, -1)
                      + cfg->bit_real) / stat_time;
    RK_S32 bps;
    RK_S32 ret = MPP_OK;

    rc_dbg_func("enter %p\n", ctx);
    rc_dbg_rc("reenc check target_bps %d last_ins_bps %d ins_bps %d",
              usr_cfg->bps_target, last_ins_bps, ins_bps);

    if (ctx->reenc_cnt >= usr_cfg->max_reencode_times)
        return MPP_OK;

    if (check_super_frame_smt(ctx, cfg))
        return MPP_NOK;

    if (usr_cfg->debreath_cfg.enable && !ctx->first_frm_flg)
        return MPP_OK;

    rc_dbg_drop("drop mode %d frame_type %d\n", usr_cfg->drop_mode, frame_type);
    if (usr_cfg->drop_mode && frame_type == INTER_P_FRAME) {
        bit_thr = (RK_S32)(usr_cfg->bps_max * (100 + usr_cfg->drop_thd) / (float)100);
        rc_dbg_drop("drop mode %d check max_bps %d bit_thr %d ins_bps %d",
                    usr_cfg->drop_mode, usr_cfg->bps_target, bit_thr, ins_bps);
        return (ins_bps > bit_thr) ? MPP_NOK : MPP_OK;
    }

    switch (frame_type) {
    case INTRA_FRAME:
        bit_thr = 3 * cfg->bit_max / 2;
        break;
    case INTER_P_FRAME:
        bit_thr = 3 * cfg->bit_max;
        break;
    default:
        break;
    }

    if (cfg->bit_real > bit_thr) {
        bps = usr_cfg->bps_max;
        if ((bps - (bps >> 3) < ins_bps) && (bps / 20  < ins_bps - last_ins_bps))
            ret =  MPP_NOK;
    }

    rc_dbg_func("leave %p ret %d\n", ctx, ret);
    return ret;
}